

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall wasm::Literal::bitmaskI8x16(Literal *__return_storage_ptr__,Literal *this)

{
  Literal *this_local;
  
  bitmask<16,_&wasm::Literal::getLanesSI8x16>(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::bitmaskI8x16() const {
  return bitmask<16, &Literal::getLanesSI8x16>(*this);
}